

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageHandler.cpp
# Opt level: O2

PDFImageXObject * __thiscall
JPEGImageHandler::CreateImageXObjectFromJPGFile
          (JPEGImageHandler *this,string *inJPGFilePath,ObjectIDType inImageXObjectID)

{
  PDFImageXObject *pPVar1;
  Trace *this_00;
  BoolAndJPEGImageInformation imageInformationResult;
  BoolAndJPEGImageInformation local_88;
  
  RetrieveImageInformation(&local_88,this,inJPGFilePath);
  if (local_88.first == false) {
    this_00 = Trace::DefaultTrace();
    pPVar1 = (PDFImageXObject *)0x0;
    Trace::TraceToLog(this_00,
                      "JPEGImageHandler::CreateImageXObjectJPGFile, unable to retrieve image information for %s"
                      ,(inJPGFilePath->_M_dataplus)._M_p);
  }
  else {
    pPVar1 = CreateAndWriteImageXObjectFromJPGInformation
                       (this,inJPGFilePath,inImageXObjectID,&local_88.second);
  }
  return pPVar1;
}

Assistant:

PDFImageXObject* JPEGImageHandler::CreateImageXObjectFromJPGFile(const std::string& inJPGFilePath,ObjectIDType inImageXObjectID)
{
	PDFImageXObject* imageXObject = NULL;

	do
	{
		// retrieve image information
		BoolAndJPEGImageInformation imageInformationResult = RetrieveImageInformation(inJPGFilePath);
		if(!imageInformationResult.first)
		{
			TRACE_LOG1("JPEGImageHandler::CreateImageXObjectJPGFile, unable to retrieve image information for %s",inJPGFilePath.c_str());
			break;
		}

		// Write Image XObject
		imageXObject = CreateAndWriteImageXObjectFromJPGInformation(inJPGFilePath,inImageXObjectID,imageInformationResult.second);

	} while(false);

	return imageXObject;

}